

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O0

void Abc_FlowRetime_RemoveInitBias(void)

{
  Abc_Obj_t *pObj;
  int iVar1;
  undefined8 *puVar2;
  int local_1c;
  int i;
  InitConstraint_t *pConstraint;
  Abc_Obj_t *pBiasNode;
  
  for (local_1c = 0; iVar1 = Vec_PtrSize(pManMR->vInitConstraints), local_1c < iVar1;
      local_1c = local_1c + 1) {
    puVar2 = (undefined8 *)Vec_PtrEntry(pManMR->vInitConstraints,local_1c);
    pObj = (Abc_Obj_t *)*puVar2;
    *puVar2 = 0;
    if (pObj != (Abc_Obj_t *)0x0) {
      Abc_NtkDeleteObj(pObj);
    }
  }
  return;
}

Assistant:

void Abc_FlowRetime_RemoveInitBias( ) {
  // Abc_Ntk_t *pNtk = pManMR->pNtk;
  Abc_Obj_t *pBiasNode;
  InitConstraint_t *pConstraint;
  int i;

  Vec_PtrForEachEntry( InitConstraint_t *, pManMR->vInitConstraints, pConstraint, i ) {
    pBiasNode = pConstraint->pBiasNode;
    pConstraint->pBiasNode = NULL;

    if (pBiasNode)
      Abc_NtkDeleteObj(pBiasNode);
  }
}